

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::listen_succeeded_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,listen_succeeded_alert *this)

{
  char *pcVar1;
  undefined8 uVar2;
  allocator<char> local_109;
  string local_108;
  char local_e8 [8];
  char ret [200];
  listen_succeeded_alert *this_local;
  
  pcVar1 = anon_unknown_62::sock_type_str(this->socket_type);
  print_endpoint_abi_cxx11_
            (&local_108,(libtorrent *)&this->address,(address *)(ulong)(uint)this->port,(int)pcVar1)
  ;
  uVar2 = std::__cxx11::string::c_str();
  snprintf(local_e8,200,"successfully listening on [%s] %s",pcVar1,uVar2);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,&local_109);
  std::allocator<char>::~allocator(&local_109);
  return __return_storage_ptr__;
}

Assistant:

std::string listen_succeeded_alert::message() const
	{
		char ret[200];
		std::snprintf(ret, sizeof(ret), "successfully listening on [%s] %s"
			, sock_type_str(socket_type), print_endpoint(address, port).c_str());
		return ret;
	}